

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O1

void duckdb::UDFSum::Finalize<duckdb::UDFSum::sum_state_t,double>
               (Vector *states,AggregateInputData *param_2,Vector *result,idx_t count,idx_t offset)

{
  long lVar1;
  double *target;
  anon_struct_16_2_bf530190 *state;
  idx_t iVar2;
  
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    Finalize<double,duckdb::UDFSum::sum_state_t>
              (result,(anon_struct_16_2_bf530190 *)**(undefined8 **)(states + 0x20),
               *(double **)(result + 0x20),(ValidityMask *)(result + 0x28),0);
    return;
  }
  duckdb::Vector::SetVectorType((VectorType)result);
  if (count != 0) {
    lVar1 = *(long *)(states + 0x20);
    target = *(double **)(result + 0x20);
    iVar2 = 0;
    do {
      state = *(anon_struct_16_2_bf530190 **)(lVar1 + iVar2 * 8);
      FlatVector::VerifyFlatVector(result);
      Finalize<double,duckdb::UDFSum::sum_state_t>
                (result,state,target,(ValidityMask *)(result + 0x28),offset + iVar2);
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			UDFSum::Finalize<RESULT_TYPE, STATE_TYPE>(result, *sdata, rdata, ConstantVector::Validity(result), 0);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			for (idx_t i = 0; i < count; i++) {
				UDFSum::Finalize<RESULT_TYPE, STATE_TYPE>(result, sdata[i], rdata, FlatVector::Validity(result),
				                                          i + offset);
			}
		}
	}